

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::DBImpl(DBImpl *this,Options *raw_options,string *dbname)

{
  undefined8 uVar1;
  Compressor *pCVar2;
  TableCache *pTVar3;
  string *in_RDX;
  long in_RSI;
  Options *in_RDI;
  Options *in_stack_00000038;
  InternalFilterPolicy *in_stack_00000040;
  InternalKeyComparator *in_stack_00000048;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  Options *in_stack_ffffffffffffffa0;
  CompactionStats *this_00;
  string *dbname_00;
  string *in_stack_ffffffffffffffd8;
  CompactionStats *pCVar4;
  VersionSet *in_stack_ffffffffffffffe0;
  
  DB::DB((DB *)in_RDI);
  in_RDI->comparator = (Comparator *)&PTR__DBImpl_00160150;
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  in_RDI->create_if_missing = (bool)(char)uVar1;
  in_RDI->error_if_exists = (bool)(char)((ulong)uVar1 >> 8);
  in_RDI->paranoid_checks = (bool)(char)((ulong)uVar1 >> 0x10);
  *(int5 *)&in_RDI->field_0xb = (int5)((ulong)uVar1 >> 0x18);
  InternalKeyComparator::InternalKeyComparator
            ((InternalKeyComparator *)in_stack_ffffffffffffffa0,
             (Comparator *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  InternalFilterPolicy::InternalFilterPolicy
            ((InternalFilterPolicy *)in_stack_ffffffffffffffa0,
             (FilterPolicy *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  SanitizeOptions(dbname,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  *(bool *)&in_RDI[1].block_cache = in_RDI->max_file_size != *(size_t *)(in_RSI + 0x18);
  *(bool *)((long)&in_RDI[1].block_cache + 1) =
       in_RDI->compressors[2] != *(Compressor **)(in_RSI + 0x30);
  std::__cxx11::string::string((string *)&in_RDI[1].block_size,in_RDX);
  pCVar2 = (Compressor *)operator_new(0x38);
  dbname_00 = (string *)&in_RDI[1].block_size;
  pTVar3 = (TableCache *)&in_RDI->block_cache;
  TableCacheSize((Options *)&in_RDI->block_cache);
  TableCache::TableCache(pTVar3,dbname_00,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  in_RDI[1].compressors[1] = pCVar2;
  in_RDI[1].compressors[2] = (Compressor *)0x0;
  port::Mutex::Mutex((Mutex *)0x10e48e);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffffa0,
             SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
  port::CondVar::CondVar
            ((CondVar *)in_stack_ffffffffffffffa0,
             (Mutex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  in_RDI[1].compressors[0x10] = (Compressor *)0x0;
  in_RDI[1].compressors[0x11] = (Compressor *)0x0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffffa0,
             SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
  in_RDI[1].compressors[0x13] = (Compressor *)0x0;
  in_RDI[1].compressors[0x14] = (Compressor *)0x0;
  in_RDI[1].compressors[0x15] = (Compressor *)0x0;
  *(undefined4 *)(in_RDI[1].compressors + 0x16) = 0;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::deque
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             0x10e521);
  pCVar2 = (Compressor *)operator_new(0x20);
  WriteBatch::WriteBatch((WriteBatch *)in_stack_ffffffffffffffa0);
  in_RDI[1].compressors[0x21] = pCVar2;
  SnapshotList::SnapshotList((SnapshotList *)in_stack_ffffffffffffffa0);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x10e566);
  *(undefined1 *)(in_RDI[1].compressors + 0x2c) = 0;
  in_RDI[1].compressors[0x2d] = (Compressor *)0x0;
  pTVar3 = (TableCache *)operator_new(0x250);
  VersionSet::VersionSet
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI,pTVar3,
             (InternalKeyComparator *)pCVar2);
  in_RDI[1].compressors[0x2e] = (Compressor *)pTVar3;
  Status::Status((Status *)(in_RDI[1].compressors + 0x2f));
  this_00 = (CompactionStats *)(in_RDI[1].compressors + 0x30);
  pCVar4 = (CompactionStats *)(in_RDI[1].compressors + 0x45);
  do {
    CompactionStats::CompactionStats(this_00);
    this_00 = this_00 + 1;
  } while (this_00 != pCVar4);
  return;
}

Assistant:

DBImpl::DBImpl(const Options& raw_options, const std::string& dbname)
    : env_(raw_options.env),
      internal_comparator_(raw_options.comparator),
      internal_filter_policy_(raw_options.filter_policy),
      options_(SanitizeOptions(dbname, &internal_comparator_,
                               &internal_filter_policy_, raw_options)),
      owns_info_log_(options_.info_log != raw_options.info_log),
      owns_cache_(options_.block_cache != raw_options.block_cache),
      dbname_(dbname),
      table_cache_(new TableCache(dbname_, options_, TableCacheSize(options_))),
      db_lock_(nullptr),
      shutting_down_(false),
      background_work_finished_signal_(&mutex_),
      mem_(nullptr),
      imm_(nullptr),
      has_imm_(false),
      logfile_(nullptr),
      logfile_number_(0),
      log_(nullptr),
      seed_(0),
      tmp_batch_(new WriteBatch),
      background_compaction_scheduled_(false),
      manual_compaction_(nullptr),
      versions_(new VersionSet(dbname_, &options_, table_cache_,
                               &internal_comparator_)) {}